

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once_atomic.cpp
# Opt level: O0

void boost::thread_detail::commit_once_region(once_flag *flag)

{
  int iVar1;
  atomic_type *paVar2;
  once_flag *in_RDI;
  pthread_mutex_scoped_lock lk;
  atomic_type *f;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  paVar2 = get_atomic_storage(in_RDI);
  pthread::pthread_mutex_scoped_lock::pthread_mutex_scoped_lock
            ((pthread_mutex_scoped_lock *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (pthread_mutex_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  (paVar2->super_base_atomic<unsigned_int,_int>).m_storage.value = 2;
  pthread::pthread_mutex_scoped_lock::~pthread_mutex_scoped_lock
            ((pthread_mutex_scoped_lock *)0x300000003);
  iVar1 = pthread_cond_broadcast((pthread_cond_t *)once_cv);
  if (iVar1 != 0) {
    __assert_fail("!pthread_cond_broadcast(&once_cv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/libs/thread/src/pthread/once_atomic.cpp"
                  ,0x4b,"void boost::thread_detail::commit_once_region(once_flag &)");
  }
  return;
}

Assistant:

BOOST_THREAD_DECL void commit_once_region(once_flag& flag) BOOST_NOEXCEPT
    {
      atomic_type& f = get_atomic_storage(flag);
      {
        pthread::pthread_mutex_scoped_lock lk(&once_mutex);
        f.store(initialized, memory_order_release);
      }
      BOOST_VERIFY(!pthread_cond_broadcast(&once_cv));
    }